

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void autocovar(double *vec,int N,double *acov,int M)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  uint uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (N < 1) {
    dVar8 = 0.0;
  }
  else {
    dVar8 = 0.0;
    uVar2 = 0;
    do {
      dVar8 = dVar8 + vec[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  if (N < M) {
    puts(
        "\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1."
        );
    printf("\n The Output Vector only contains N calculated values.");
    uVar5 = N - 1;
  }
  else {
    uVar5 = 0;
    if (0 < M) {
      uVar5 = M;
    }
  }
  if (0 < (int)uVar5) {
    dVar6 = (double)N;
    dVar8 = dVar8 / dVar6;
    lVar1 = (long)N;
    uVar2 = 0;
    pdVar3 = vec;
    do {
      acov[uVar2] = 0.0;
      if ((long)uVar2 < lVar1) {
        dVar7 = acov[uVar2];
        uVar4 = 0;
        do {
          dVar7 = dVar7 + (pdVar3[uVar4] - dVar8) * (vec[uVar4] - dVar8);
          acov[uVar2] = dVar7;
          uVar4 = uVar4 + 1;
        } while ((uint)N != uVar4);
      }
      acov[uVar2] = acov[uVar2] / dVar6;
      uVar2 = uVar2 + 1;
      N = N - 1;
      pdVar3 = pdVar3 + 1;
    } while (uVar2 != uVar5);
  }
  return;
}

Assistant:

void autocovar(double* vec,int N, double* acov,int M) {
	double m,temp1,temp2;
	int i,t;
	m = mean(vec,N);
	
	if ( M > N) {
		M = N-1;
		printf("\n Lag is greater than the length N of the input vector. It is automatically set to length N - 1.\n");
		printf("\n The Output Vector only contains N calculated values.");
	} else if ( M < 0) {
		M = 0;
	}
	
	for(i = 0; i < M;i++) {
		acov[i] = 0.0;
		for (t = 0; t < N-i;t++) {
			temp1 = vec[t] - m;
			temp2 = vec[t+i] - m;
			acov[i]+= temp1*temp2;
		}
		acov[i] = acov[i] / N;
		
	}
	
	
}